

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockNodeUpdate(ImGuiDockNode *node)

{
  float fVar1;
  ushort uVar2;
  ImGuiViewportP *pIVar3;
  ImDrawList *pIVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ImVec2 IVar14;
  ImGuiViewportFlags IVar15;
  ImGuiViewportFlags IVar16;
  ImGuiContext *pIVar17;
  int iVar19;
  bool bVar18;
  ImU32 IVar20;
  ImGuiID IVar21;
  ImGuiID IVar22;
  ImGuiContext *g;
  long lVar23;
  ImGuiWindow *pIVar24;
  ImGuiTabItem *pIVar25;
  ulong uVar26;
  ImGuiID *pIVar27;
  short sVar28;
  float fVar29;
  ulong uVar30;
  ImGuiDockNode *pIVar31;
  ImVec2 *pIVar32;
  ImGuiDockNode *pIVar33;
  char *pcVar34;
  int iVar35;
  bool *p_open;
  uint uVar36;
  ImGuiWindow *pIVar37;
  byte bVar38;
  bool bVar39;
  undefined8 unaff_R12;
  undefined8 uVar40;
  ImGuiContext *pIVar41;
  long lVar42;
  uint uVar43;
  ImVec2 IVar44;
  char cVar45;
  ImGuiPayload *pIVar46;
  ImVec2 this;
  float fVar47;
  float fVar48;
  float fVar49;
  ImRect outer;
  ImRect inner;
  char window_label [20];
  ImRect title_bar_rect;
  ImVec2 window_menu_button_pos;
  ImRect tab_bar_rect;
  uint local_fc;
  undefined1 local_f8 [8];
  undefined8 uStack_f0;
  int local_e8;
  ulong local_d8;
  ulong local_d0;
  ImRect local_c8;
  ImVec2 local_b8;
  undefined8 uStack_b0;
  ImVec2 local_a8;
  undefined8 uStack_a0;
  ImRect *local_98;
  ImGuiContext *local_90;
  uint local_84;
  undefined8 local_80;
  ImVec2 local_78;
  undefined8 uStack_70;
  ImVec2 local_68;
  undefined8 uStack_60;
  ulong local_58;
  ImVec2 local_50;
  ImRect local_48;
  
  pIVar41 = GImGui;
  if (node->LastFrameActive == GImGui->FrameCount) {
    __assert_fail("node->LastFrameActive != g.FrameCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3285,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
  }
  node->LastFrameAlive = GImGui->FrameCount;
  node->field_0xba = node->field_0xba & 0xf7;
  node->CentralNode = (ImGuiDockNode *)0x0;
  node->OnlyNodeWithWindows = (ImGuiDockNode *)0x0;
  if (node->ParentNode == (ImGuiDockNode *)0x0) {
    DockNodeUpdateVisibleFlagAndInactiveChilds(node);
    local_f8._0_4_ = 0.0;
    local_f8._4_4_ = 0.0;
    uStack_f0 = (ImGuiDockNode *)0x0;
    local_e8 = 0;
    DockNodeFindInfo(node,(ImGuiDockNodeFindInfoResults *)local_f8);
    node->CentralNode = (ImGuiDockNode *)local_f8;
    pIVar31 = (ImGuiDockNode *)0x0;
    if (local_e8 == 1) {
      pIVar31 = uStack_f0;
    }
    node->OnlyNodeWithWindows = pIVar31;
    if (uStack_f0 != (ImGuiDockNode *)0x0 && node->LastFocusedNodeId == 0) {
      node->LastFocusedNodeId = uStack_f0->ID;
    }
    if (uStack_f0 != (ImGuiDockNode *)0x0) {
      if ((uStack_f0->Windows).Size < 1) goto LAB_0013dc99;
      pIVar24 = *(uStack_f0->Windows).Data;
      IVar22 = (pIVar24->WindowClass).ClassId;
      IVar21 = (pIVar24->WindowClass).ParentViewportId;
      IVar15 = (pIVar24->WindowClass).ViewportFlagsOverrideSet;
      IVar16 = (pIVar24->WindowClass).ViewportFlagsOverrideClear;
      uVar5 = *(undefined4 *)((long)&(pIVar24->WindowClass).ViewportFlagsOverrideClear + 2);
      uVar6 = *(undefined4 *)((long)&(pIVar24->WindowClass).DockNodeFlagsOverrideSet + 2);
      uVar7 = *(undefined4 *)((long)&(pIVar24->WindowClass).DockNodeFlagsOverrideClear + 2);
      *(undefined4 *)((long)&(node->WindowClass).ViewportFlagsOverrideSet + 2) =
           *(undefined4 *)((long)&(pIVar24->WindowClass).ViewportFlagsOverrideSet + 2);
      *(undefined4 *)((long)&(node->WindowClass).ViewportFlagsOverrideClear + 2) = uVar5;
      *(undefined4 *)((long)&(node->WindowClass).DockNodeFlagsOverrideSet + 2) = uVar6;
      *(undefined4 *)((long)&(node->WindowClass).DockNodeFlagsOverrideClear + 2) = uVar7;
      (node->WindowClass).ClassId = IVar22;
      (node->WindowClass).ParentViewportId = IVar21;
      (node->WindowClass).ViewportFlagsOverrideSet = IVar15;
      (node->WindowClass).ViewportFlagsOverrideClear = IVar16;
      lVar23 = (long)(uStack_f0->Windows).Size;
      if (1 < lVar23) {
        lVar42 = 1;
        do {
          pIVar24 = (uStack_f0->Windows).Data[lVar42];
          if ((pIVar24->WindowClass).DockingAllowUnclassed == false) {
            IVar22 = (pIVar24->WindowClass).ClassId;
            IVar21 = (pIVar24->WindowClass).ParentViewportId;
            IVar15 = (pIVar24->WindowClass).ViewportFlagsOverrideSet;
            IVar16 = (pIVar24->WindowClass).ViewportFlagsOverrideClear;
            uVar5 = *(undefined4 *)((long)&(pIVar24->WindowClass).ViewportFlagsOverrideClear + 2);
            uVar6 = *(undefined4 *)((long)&(pIVar24->WindowClass).DockNodeFlagsOverrideSet + 2);
            uVar7 = *(undefined4 *)((long)&(pIVar24->WindowClass).DockNodeFlagsOverrideClear + 2);
            *(undefined4 *)((long)&(node->WindowClass).ViewportFlagsOverrideSet + 2) =
                 *(undefined4 *)((long)&(pIVar24->WindowClass).ViewportFlagsOverrideSet + 2);
            *(undefined4 *)((long)&(node->WindowClass).ViewportFlagsOverrideClear + 2) = uVar5;
            *(undefined4 *)((long)&(node->WindowClass).DockNodeFlagsOverrideSet + 2) = uVar6;
            *(undefined4 *)((long)&(node->WindowClass).DockNodeFlagsOverrideClear + 2) = uVar7;
            (node->WindowClass).ClassId = IVar22;
            (node->WindowClass).ParentViewportId = IVar21;
            (node->WindowClass).ViewportFlagsOverrideSet = IVar15;
            (node->WindowClass).ViewportFlagsOverrideClear = IVar16;
            break;
          }
          lVar42 = lVar42 + 1;
        } while (lVar23 != lVar42);
      }
    }
  }
  if ((node->TabBar != (ImGuiTabBar *)0x0) && ((node->LocalFlags & 0x1000) != 0)) {
    IM_DELETE<ImGuiTabBar>(node->TabBar);
    node->TabBar = (ImGuiTabBar *)0x0;
  }
  uVar43 = (node->Windows).Size;
  if (((((int)uVar43 < 2) && (node->ParentNode == (ImGuiDockNode *)0x0)) &&
      ((node->LocalFlags & 0x400U) == 0)) &&
     ((node->ChildNodes[0] == (ImGuiDockNode *)0x0 &&
      ((pIVar41->IO).ConfigDockingAlwaysTabBar == false)))) {
    if ((ulong)uVar43 == 0) {
LAB_0013c8f7:
      DockNodeHideHostWindow(node);
      node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
      node->WantCloseTabId = 0;
      node->field_0xb9 = node->field_0xb9 & 0x87;
      node->LastFrameActive = pIVar41->FrameCount;
      if ((node->field_0xba & 1) == 0) {
        return;
      }
      if ((node->Windows).Size != 1) {
        return;
      }
      DockNodeStartMouseMovingWindow(node,*(node->Windows).Data);
      return;
    }
    if (uVar43 != 1) {
LAB_0013dc99:
      pcVar34 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
LAB_0013dc13:
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                    ,0x5c2,pcVar34);
    }
    if (((*(node->Windows).Data)->WindowClass).DockingAlwaysTabBar == false) {
      pIVar24 = *(node->Windows).Data;
      node->Pos = pIVar24->Pos;
      node->Size = pIVar24->SizeFull;
      *(ushort *)&node->field_0xb8 = (ushort)*(undefined4 *)&node->field_0xb8 & 0xfe00 | 0x92;
      if ((node->HostWindow != (ImGuiWindow *)0x0) && (pIVar41->NavWindow == node->HostWindow)) {
        FocusWindow(pIVar24);
      }
      pIVar37 = node->HostWindow;
      if (pIVar37 != (ImGuiWindow *)0x0) {
        pIVar3 = pIVar37->Viewport;
        pIVar24->Viewport = pIVar3;
        pIVar24->ViewportId = pIVar37->ViewportId;
        if (pIVar37->ViewportOwned == true) {
          pIVar3->Window = pIVar24;
          pIVar24->ViewportOwned = true;
        }
      }
      goto LAB_0013c8f7;
    }
  }
  if (((((*(uint *)&node->field_0xb8 >> 9 & 1) != 0) && (node->HostWindow == (ImGuiWindow *)0x0)) &&
      (node->ParentNode == (ImGuiDockNode *)0x0)) &&
     (((node->LocalFlags & 0x400U) == 0 && (node->ChildNodes[0] == (ImGuiDockNode *)0x0)))) {
    if ((int)uVar43 < 1) {
      __assert_fail("node->Windows.Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,12999,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
    }
    if (node->SelectedTabId != 0) {
      uVar30 = 0;
      do {
        pIVar24 = (node->Windows).Data[uVar30];
        if (pIVar24->ID == node->SelectedTabId) goto LAB_0013c7ba;
        uVar30 = uVar30 + 1;
      } while (uVar43 != uVar30);
    }
    pIVar24 = (ImGuiWindow *)0x0;
LAB_0013c7ba:
    if (pIVar24 == (ImGuiWindow *)0x0) {
      pIVar24 = *(node->Windows).Data;
    }
    if (('\0' < pIVar24->AutoFitFramesX) || ('\0' < pIVar24->AutoFitFramesY)) {
      node->State = ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing;
      return;
    }
  }
  uVar36 = node->SharedFlags | node->LocalFlags;
  uVar2 = (ushort)*(uint *)&node->field_0xb8;
  if (((uint)node->LocalFlags >> 10 & 1) == 0) {
    *(ushort *)&node->field_0xb8 =
         (ushort)((uVar36 >> 0xe & 1) == 0 && 0 < (int)uVar43) << 0xc |
         uVar2 & 0xc7ff | (ushort)(-1 < (short)uVar36 && 0 < (int)uVar43) << 0xb;
    uVar43 = (node->Windows).Size;
    uVar30 = (ulong)uVar43;
    if ((int)uVar43 < 1) {
      bVar39 = false;
    }
    else {
      lVar23 = 0;
      do {
        pIVar24 = (node->Windows).Data[lVar23];
        pIVar24->field_0x492 = pIVar24->field_0x492 & 0xfe | 1 < (int)uVar30;
        iVar19._0_1_ = pIVar24->HasCloseButton;
        iVar19._1_1_ = pIVar24->ResizeBorderHeld;
        iVar19._2_2_ = pIVar24->BeginCount;
        *(ushort *)&node->field_0xb8 = *(ushort *)&node->field_0xb8 | (ushort)(iVar19 << 0xd);
        lVar23 = lVar23 + 1;
        iVar19 = (node->Windows).Size;
        uVar30 = (ulong)iVar19;
      } while (lVar23 < (long)uVar30);
      bVar39 = 0 < iVar19;
    }
    pIVar17 = GImGui;
    if (node->ParentNode == (ImGuiDockNode *)0x0) {
      if ((*(uint *)&node->field_0xb8 >> 9 & 1) == 0) {
        uVar40 = 0;
        pIVar24 = (ImGuiWindow *)0x0;
      }
      else {
        if (bVar39) {
          pIVar24 = *(node->Windows).Data;
        }
        else {
          pIVar24 = (ImGuiWindow *)0x0;
        }
        uVar43 = *(uint *)&node->field_0xb8 & 7;
        if (pIVar24 == (ImGuiWindow *)0x0 || uVar43 != 2) {
          if (uVar43 == 1) {
            pIVar32 = &node->Pos;
            goto LAB_0013c982;
          }
        }
        else {
          pIVar32 = &pIVar24->Pos;
LAB_0013c982:
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 1;
          (pIVar17->NextWindowData).PosVal = *pIVar32;
          (pIVar17->NextWindowData).PosPivotVal.x = 0.0;
          (pIVar17->NextWindowData).PosPivotVal.y = 0.0;
          (pIVar17->NextWindowData).PosCond = 1;
          (pIVar17->NextWindowData).PosUndock = true;
        }
        pIVar17 = GImGui;
        sVar28 = (short)((uint)(int)(short)(*(int *)&node->field_0xb8 << 10) >> 0xd);
        if (sVar28 == 2 && pIVar24 != (ImGuiWindow *)0x0) {
          pIVar32 = &pIVar24->SizeFull;
LAB_0013c9ec:
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
          (pIVar17->NextWindowData).SizeVal = *pIVar32;
          (pIVar17->NextWindowData).SizeCond = 1;
        }
        else if (sVar28 == 1) {
          pIVar32 = &node->Size;
          goto LAB_0013c9ec;
        }
        pIVar17 = GImGui;
        if ((*(ushort *)&node->field_0xb8 & 0x38) == 0x10 && pIVar24 != (ImGuiWindow *)0x0) {
          bVar39 = pIVar24->Collapsed;
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 8;
          (pIVar17->NextWindowData).CollapsedVal = bVar39;
          (pIVar17->NextWindowData).CollapsedCond = 1;
        }
        pIVar17 = GImGui;
        if ((*(ushort *)&node->field_0xb8 & 0x1c0) == 0x80 && pIVar24 != (ImGuiWindow *)0x0) {
          IVar22 = pIVar24->ViewportId;
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 0x100;
          (pIVar17->NextWindowData).ViewportId = IVar22;
        }
        SetNextWindowClass(&node->WindowClass);
        ImFormatString(local_f8,0x14,"##DockNode_%02X",(ulong)node->ID);
        local_c8.Min.x = 0.0;
        local_c8.Min.y = 0.0;
        PushStyleVar(1,&local_c8.Min);
        Begin(local_f8,(bool *)0x0,0x20081139);
        PopStyleVar(1);
        pIVar24 = pIVar41->CurrentWindow;
        node->HostWindow = pIVar24;
        pIVar24->DockNodeAsHost = node;
        IVar44 = pIVar24->Pos;
        (pIVar24->DC).CursorPos = IVar44;
        node->Pos = IVar44;
        node->Size = pIVar24->Size;
        if (node->HostWindow->Appearing == true) {
          BringWindowToDisplayFront(node->HostWindow);
        }
        *(ushort *)&node->field_0xb8 = *(ushort *)&node->field_0xb8 & 0xfe00;
        uVar40 = CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
      }
    }
    else {
      pIVar24 = node->ParentNode->HostWindow;
      node->HostWindow = pIVar24;
      *(ushort *)&node->field_0xb8 = *(ushort *)&node->field_0xb8 & 0xfe00;
      uVar40 = 0;
    }
    if (((node->field_0xba & 1) != 0) && (node->HostWindow != (ImGuiWindow *)0x0)) {
      DockNodeStartMouseMovingWindow(node,node->HostWindow);
    }
  }
  else {
    pIVar24 = node->HostWindow;
    if (pIVar24 == (ImGuiWindow *)0x0) {
      __assert_fail("node->HostWindow",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x32dc,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
    }
    *(ushort *)&node->field_0xb8 =
         ((ushort)(uVar36 >> 2) & 0x1000 | uVar2 & 0xc7ff | (ushort)(uVar36 >> 4) & 0x800) ^ 0x1800;
    uVar40 = 0;
  }
  if ((node->ChildNodes[0] != (ImGuiDockNode *)0x0) && (node->TabBar != (ImGuiTabBar *)0x0)) {
    __assert_fail("node->TabBar == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3333,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
  }
  if ((node->ParentNode == (ImGuiDockNode *)0x0) && (pIVar41->NavWindow != (ImGuiWindow *)0x0)) {
    pIVar37 = pIVar41->NavWindow->RootWindowDockStop;
    pIVar31 = pIVar37->DockNode;
    if ((pIVar31 != (ImGuiDockNode *)0x0) && (pIVar37->ParentWindow == pIVar24)) {
      node->LastFocusedNodeId = pIVar31->ID;
    }
  }
  cVar45 = '\0';
  if ((node->ParentNode == (ImGuiDockNode *)0x0) && (cVar45 = '\0', pIVar24 != (ImGuiWindow *)0x0))
  {
    cVar45 = (char)((uVar36 & 8) >> 3);
  }
  local_90 = pIVar41;
  local_80 = uVar40;
  if (cVar45 != '\0') {
    ImDrawListSplitter::Split(&pIVar24->DrawList->_Splitter,pIVar24->DrawList,2);
    ImDrawListSplitter::SetCurrentChannel(&pIVar24->DrawList->_Splitter,pIVar24->DrawList,1);
  }
  pIVar31 = node->CentralNode;
  bVar39 = false;
  if ((node->ParentNode == (ImGuiDockNode *)0x0) && (bVar39 = false, pIVar24 != (ImGuiWindow *)0x0))
  {
    if ((pIVar31 != (ImGuiDockNode *)0x0 & (byte)uVar36 >> 3) == 1) {
      bVar39 = (pIVar31->Windows).Size == 0 && pIVar31->ChildNodes[0] == (ImGuiDockNode *)0x0;
    }
    else {
      bVar39 = false;
    }
  }
  bVar18 = bVar39;
  if (bVar39) {
    pIVar46 = (ImGuiPayload *)0x0;
    if (GImGui->DragDropActive != false) {
      pIVar46 = &GImGui->DragDropPayload;
    }
    if (((GImGui->DragDropActive == true) && (pIVar46->DataFrameCount != -1)) &&
       (iVar19 = strcmp("_IMWINDOW",pIVar46->DataType), iVar19 == 0)) {
      bVar18 = DockNodeIsDropAllowed(pIVar24,*pIVar46->Data);
      bVar18 = (bool)(!bVar18 & bVar39);
    }
  }
  if (bVar18) {
    if ((node->LocalFlags & 0x400) == 0) {
      __assert_fail("node->IsDockSpace()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x334c,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
    }
    local_f8._0_4_ = (pIVar31->Pos).x;
    local_f8._0_4_ = (float)local_f8._0_4_ + 4.0;
    local_f8._4_4_ = (pIVar31->Pos).y;
    local_f8._4_4_ = (float)local_f8._4_4_ + 4.0;
    fVar48 = (pIVar31->Pos).x + (pIVar31->Size).x + -4.0;
    fVar49 = (pIVar31->Pos).y + (pIVar31->Size).y + -4.0;
    uStack_f0 = (ImGuiDockNode *)CONCAT44(fVar49,fVar48);
    if (((bVar39) && ((float)local_f8._0_4_ <= fVar48)) && ((float)local_f8._4_4_ <= fVar49)) {
      local_c8.Min.y = fVar49 - (float)local_f8._4_4_;
      local_c8.Min.x = fVar48 - (float)local_f8._0_4_;
      SetWindowHitTestHole(pIVar24,(ImVec2 *)local_f8,&local_c8.Min);
      local_c8.Min.y = uStack_f0._4_4_ - (float)local_f8._4_4_;
      local_c8.Min.x = (float)uStack_f0 - (float)local_f8._0_4_;
      SetWindowHitTestHole(pIVar24->ParentWindow,(ImVec2 *)local_f8,&local_c8.Min);
    }
  }
  if ((node->ParentNode == (ImGuiDockNode *)0x0) && (pIVar24 != (ImGuiWindow *)0x0)) {
    DockNodeTreeUpdatePosSize(node,pIVar24->Pos,pIVar24->Size,false);
    DockNodeTreeUpdateSplitter(node);
  }
  if ((((pIVar24 != (ImGuiWindow *)0x0) && (node->ChildNodes[0] == (ImGuiDockNode *)0x0)) &&
      ((node->Windows).Size == 0)) &&
     (((uVar36 & 8) == 0 && ((*(ushort *)&node->field_0xb8 & 0x200) != 0)))) {
    pIVar4 = pIVar24->DrawList;
    local_c8.Min.y = (node->Pos).y + (node->Size).y;
    local_c8.Min.x = (node->Pos).x + (node->Size).x;
    local_f8 = *(undefined1 (*) [8])((GImGui->Style).Colors + 0x27);
    uVar8 = (GImGui->Style).Colors[0x27].z;
    uVar9 = (GImGui->Style).Colors[0x27].w;
    uStack_f0 = (ImGuiDockNode *)CONCAT44((GImGui->Style).Alpha * (float)uVar9,uVar8);
    IVar20 = ColorConvertFloat4ToU32((ImVec4 *)local_f8);
    ImDrawList::AddRectFilled(pIVar4,&node->Pos,&local_c8.Min,IVar20,0.0,0xf);
  }
  if ((cVar45 != '\0') && ((node->field_0xb9 & 2) != 0)) {
    ImDrawListSplitter::SetCurrentChannel(&pIVar24->DrawList->_Splitter,pIVar24->DrawList,0);
    pIVar4 = pIVar24->DrawList;
    if (bVar39) {
      local_a8.y = (node->Pos).y + (node->Size).y;
      local_a8.x = (node->Pos).x + (node->Size).x;
      uStack_a0 = 0;
      local_b8.y = (pIVar31->Pos).y + (pIVar31->Size).y;
      local_b8.x = (pIVar31->Pos).x + (pIVar31->Size).x;
      uStack_b0 = 0;
      local_68 = pIVar31->Pos;
      uStack_60 = 0;
      local_78 = node->Pos;
      uStack_70 = 0;
      local_f8 = *(undefined1 (*) [8])((GImGui->Style).Colors + 2);
      uVar10 = (GImGui->Style).Colors[2].z;
      uVar11 = (GImGui->Style).Colors[2].w;
      uStack_f0 = (ImGuiDockNode *)CONCAT44((GImGui->Style).Alpha * (float)uVar11,uVar10);
      IVar20 = ColorConvertFloat4ToU32((ImVec4 *)local_f8);
      outer.Max = local_a8;
      outer.Min = local_78;
      inner.Max = local_b8;
      inner.Min = local_68;
      RenderRectFilledWithHole(pIVar4,outer,inner,IVar20,0.0);
    }
    else {
      local_c8.Min.y = (node->Pos).y + (node->Size).y;
      local_c8.Min.x = (node->Pos).x + (node->Size).x;
      local_f8 = *(undefined1 (*) [8])((GImGui->Style).Colors + 2);
      uVar12 = (GImGui->Style).Colors[2].z;
      uVar13 = (GImGui->Style).Colors[2].w;
      uStack_f0 = (ImGuiDockNode *)CONCAT44((GImGui->Style).Alpha * (float)uVar13,uVar12);
      IVar20 = ColorConvertFloat4ToU32((ImVec4 *)local_f8);
      ImDrawList::AddRectFilled(pIVar4,&node->Pos,&local_c8.Min,IVar20,0.0,0xf);
    }
    ImDrawListSplitter::Merge(&pIVar24->DrawList->_Splitter,pIVar24->DrawList);
  }
  IVar44 = (ImVec2)GImGui;
  pIVar41 = local_90;
  if ((pIVar24 == (ImGuiWindow *)0x0) || ((node->Windows).Size < 1)) {
    node->WantCloseTabId = 0;
    node->field_0xb9 = node->field_0xb9 & 0xbb;
  }
  else {
    IVar22 = node->WantCloseTabId;
    fVar48 = (float)GImGui->FrameCount;
    uVar2 = *(ushort *)&node->field_0xb8;
    *(ushort *)&node->field_0xb8 = uVar2 & 0xbfff;
    node->WantCloseTabId = 0;
    pIVar31 = node;
    do {
      pIVar33 = pIVar31;
      pIVar31 = pIVar33->ParentNode;
    } while (pIVar33->ParentNode != (ImGuiDockNode *)0x0);
    fVar49 = (float)(node->LastFrameActive + 1);
    if (((ImGuiContext *)IVar44)->NavWindowingTarget == (ImGuiWindow *)0x0) {
      if ((((ImGuiContext *)IVar44)->NavWindow != (ImGuiWindow *)0x0) &&
         (((ImGuiContext *)IVar44)->NavWindow->RootWindowForTitleBarHighlight == pIVar24->RootWindow
         )) {
        bVar39 = pIVar33->LastFocusedNodeId == node->ID;
        goto LAB_0013d093;
      }
      local_fc = 0;
    }
    else {
      bVar39 = ((ImGuiContext *)IVar44)->NavWindowingTarget->DockNode == node;
LAB_0013d093:
      local_fc = (uint)bVar39;
    }
    bVar38 = (byte)local_fc;
    if ((node->LocalFlags & 0x3000U) == 0) {
      local_78.x = fVar48;
      local_68.x = fVar49;
      local_98 = (ImRect *)CONCAT44(local_98._4_4_,(uint)uVar2);
      bVar39 = pIVar24->SkipItems;
      if (((uint)node->LocalFlags >> 10 & 1) == 0) {
        pIVar24->SkipItems = false;
        (pIVar24->DC).NavLayerCurrent = ImGuiNavLayer_Menu;
      }
      PushOverrideID(node->ID);
      this = (ImVec2)node->TabBar;
      local_b8 = this;
      if (this == (ImVec2)0x0) {
        DockNodeAddTabBar(node);
        this = (ImVec2)node->TabBar;
      }
      *(ushort *)&node->field_0xb8 =
           (ushort)*(undefined4 *)&node->field_0xb8 & 0xfbff | (ushort)(local_fc << 10);
      local_84 = node->LocalFlags | node->SharedFlags;
      uVar30 = 0;
      if ((local_84 >> 0xe & 1) == 0) {
        uVar30 = (ulong)((((ImGuiContext *)IVar44)->Style).WindowMenuButtonPosition != -1);
      }
      local_a8 = IVar44;
      if ((char)uVar30 == '\0') {
        local_d0 = 0;
      }
      else {
        local_d0 = 0;
        IVar21 = ImGuiWindow::GetID(GImGui->CurrentWindow,"#WindowMenu",(char *)0x0);
        bVar18 = IsPopupOpen(IVar21,0);
        pIVar41 = GImGui;
        if (bVar18) {
          if ((GImGui->Style).WindowMenuButtonPosition == 0) {
            fVar29 = (GImGui->Style).FramePadding.y;
            fVar47 = fVar29 + fVar29 + GImGui->FontSize + (node->Pos).y;
            fVar29 = (node->Pos).x;
            (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 1;
            (pIVar41->NextWindowData).PosVal.x = fVar29;
            fVar29 = 0.0;
          }
          else {
            fVar29 = (node->Pos).x;
            fVar1 = (node->Size).x;
            fVar47 = (GImGui->Style).FramePadding.y;
            fVar47 = fVar47 + fVar47 + GImGui->FontSize + (node->Pos).y;
            (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 1;
            (pIVar41->NextWindowData).PosVal.x = fVar29 + fVar1;
            fVar29 = 1.0;
          }
          (pIVar41->NextWindowData).PosVal.y = fVar47;
          (pIVar41->NextWindowData).PosPivotVal.x = fVar29;
          (pIVar41->NextWindowData).PosPivotVal.y = 0.0;
          (pIVar41->NextWindowData).PosCond = 1;
          (pIVar41->NextWindowData).PosUndock = true;
          local_d0 = 0;
          bVar18 = BeginPopup("#WindowMenu",0);
          uVar43 = 0;
          if (bVar18) {
            node->field_0xb9 = node->field_0xb9 | 4;
            local_58 = uVar30;
            if (*(int *)this == 1) {
              local_d8 = 0;
              bVar18 = MenuItem("Hide tab bar",(char *)0x0,
                                (bool)((byte)((uint)node->LocalFlags >> 0xd) & 1),true);
              if (bVar18) {
                node->field_0xba = node->field_0xba | 4;
              }
            }
            else if (*(int *)this < 1) {
              local_d8 = 0;
            }
            else {
              lVar42 = 0;
              lVar23 = 0;
              local_d8 = 0;
              do {
                if ((*(byte *)((long)&(*(ImGuiTabItem **)((long)this + 8))->Flags + lVar42 + 2) &
                    0x20) == 0) {
                  pIVar25 = (ImGuiTabItem *)
                            ((long)&(*(ImGuiTabItem **)((long)this + 8))->ID + lVar42);
                  pcVar34 = ImGuiTabBar::GetTabName((ImGuiTabBar *)this,pIVar25);
                  local_f8._0_4_ = 0.0;
                  local_f8._4_4_ = 0.0;
                  bVar18 = Selectable(pcVar34,pIVar25->ID == *(ImGuiID *)((long)this + 0x18),0,
                                      (ImVec2 *)local_f8);
                  pIVar41 = GImGui;
                  if (bVar18) {
                    local_d8 = (ulong)pIVar25->ID;
                  }
                  pIVar37 = GImGui->CurrentWindow;
                  pIVar37->WriteAccessed = true;
                  if (pIVar37->SkipItems == false) {
                    (pIVar37->DC).CursorPos.x =
                         (pIVar41->Style).ItemSpacing.x + (pIVar37->DC).CursorPosPrevLine.x;
                    (pIVar37->DC).CursorPos.y = (pIVar37->DC).CursorPosPrevLine.y;
                    (pIVar37->DC).CurrLineSize = (pIVar37->DC).PrevLineSize;
                    (pIVar37->DC).CurrLineTextBaseOffset = (pIVar37->DC).PrevLineTextBaseOffset;
                  }
                  Text("   ");
                }
                lVar23 = lVar23 + 1;
                lVar42 = lVar42 + 0x30;
                IVar44 = local_a8;
              } while (lVar23 < *(int *)this);
            }
            EndPopup();
            uVar43 = (uint)local_d8;
            uVar30 = local_58;
          }
          if (uVar43 != 0) {
            *(uint *)((long)this + 0x1c) = uVar43;
            local_d0 = (ulong)uVar43;
          }
          local_fc = (uint)(byte)(bVar38 | (node->field_0xb9 & 4) >> 2);
        }
      }
      local_c8.Min.x = 0.0;
      local_c8.Min.y = 0.0;
      local_c8.Max.x = 0.0;
      local_c8.Max.y = 0.0;
      local_48.Min.x = 0.0;
      local_48.Min.y = 0.0;
      local_48.Max.x = 0.0;
      local_48.Max.y = 0.0;
      local_50.x = 0.0;
      local_50.y = 0.0;
      DockNodeCalcTabBarLayout(node,&local_c8,&local_48,&local_50);
      iVar19 = 10;
      if ((char)local_fc != '\0') {
        node->LastFrameFocused = *(int *)((long)IVar44 + 0x1b18);
        iVar19 = 0xb;
      }
      iVar35 = 0xc;
      if (pIVar24->Collapsed == false) {
        iVar35 = iVar19;
      }
      pIVar32 = (ImVec2 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uint)(iVar35 << 4));
      local_f8 = *(undefined1 (*) [8])pIVar32;
      IVar14 = pIVar32[1];
      uStack_f0._4_4_ = IVar14.y;
      uStack_f0._0_4_ = IVar14.x;
      uStack_f0 = (ImGuiDockNode *)
                  CONCAT44((GImGui->Style).Alpha * uStack_f0._4_4_,(float)uStack_f0);
      IVar20 = ColorConvertFloat4ToU32((ImVec4 *)local_f8);
      ImDrawList::AddRectFilled
                (pIVar24->DrawList,&local_c8.Min,&local_c8.Max,IVar20,pIVar24->WindowRounding,3);
      if ((char)uVar30 != '\0') {
        IVar21 = ImGuiWindow::GetID(pIVar24,"#COLLAPSE",(char *)0x0);
        bVar18 = CollapseButton(IVar21,&local_50,node);
        if (bVar18) {
          IVar21 = ImGuiWindow::GetID(GImGui->CurrentWindow,"#WindowMenu",(char *)0x0);
          OpenPopupEx(IVar21,0);
        }
        if ((GImGui->ActiveId != 0) && (GImGui->ActiveId == (GImGui->CurrentWindow->DC).LastItemId))
        {
          local_d0 = (ulong)*(ImGuiID *)((long)this + 0x18);
        }
      }
      local_d8 = CONCAT44(local_d8._4_4_,*(undefined4 *)this);
      if (0 < (node->Windows).Size) {
        lVar23 = 0;
        do {
          pIVar37 = (node->Windows).Data[lVar23];
          if ((*(ImGuiWindow **)((long)IVar44 + 0x1d70) != (ImGuiWindow *)0x0) &&
             ((*(ImGuiWindow **)((long)IVar44 + 0x1d70))->RootWindowDockStop == pIVar37)) {
            *(ImGuiID *)((long)this + 0x18) = pIVar37->ID;
          }
          pIVar25 = TabBarFindTabByID((ImGuiTabBar *)this,pIVar37->ID);
          if (pIVar25 == (ImGuiTabItem *)0x0) {
            TabBarAddTab((ImGuiTabBar *)this,0x400000,pIVar37);
          }
          lVar23 = lVar23 + 1;
        } while (lVar23 < (node->Windows).Size);
      }
      uVar43 = *(uint *)this;
      uVar26 = (ulong)(int)uVar43;
      uVar30 = (ulong)uVar43;
      if (0 < (long)uVar26) {
        lVar23 = uVar26 * 0x30 + -0x2c;
        uVar30 = uVar26;
        do {
          if ((long)*(int *)this < (long)uVar30) {
            pcVar34 = "T &ImVector<ImGuiTabItem>::operator[](int) [T = ImGuiTabItem]";
            goto LAB_0013dc13;
          }
          uVar36 = *(uint *)((long)&(*(ImGuiTabItem **)((long)this + 8))->ID + lVar23);
          if ((uVar36 >> 0x16 & 1) == 0) goto LAB_0013d742;
          *(uint *)((long)&(*(ImGuiTabItem **)((long)this + 8))->ID + lVar23) = uVar36 & 0xffbfffff;
          lVar23 = lVar23 + -0x30;
          bVar18 = 1 < (long)uVar30;
          uVar30 = uVar30 - 1;
        } while (bVar18);
        uVar30 = 0;
      }
LAB_0013d742:
      iVar19 = (int)uVar30;
      if ((uVar43 - iVar19 != 0 && iVar19 <= (int)uVar43) && iVar19 + 1 < (int)uVar43) {
        qsort(*(ImGuiTabItem **)((long)this + 8) + iVar19,(long)(int)(uVar43 - iVar19),0x30,
              TabItemComparerByDockOrder);
      }
      if ((local_b8 == (ImVec2)0x0) &&
         (pIVar25 = TabBarFindTabByID((ImGuiTabBar *)this,node->SelectedTabId),
         pIVar25 != (ImGuiTabItem *)0x0)) {
        pIVar27 = &node->SelectedTabId;
LAB_0013d7cc:
        IVar21 = *pIVar27;
        *(ImGuiID *)((long)this + 0x1c) = IVar21;
        *(ImGuiID *)((long)this + 0x18) = IVar21;
      }
      else {
        uVar43 = *(uint *)this;
        if ((int)local_d8 < (int)uVar43) {
          if ((int)uVar43 < 1) {
            __assert_fail("Size > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                          ,0x5cc,"T &ImVector<ImGuiTabItem>::back() [T = ImGuiTabItem]");
          }
          pIVar27 = &((*(ImGuiTabItem **)((long)this + 8))[(ulong)uVar43 - 1].Window)->ID;
          goto LAB_0013d7cc;
        }
      }
      uVar43 = local_fc << 0x15 | 0x500003;
      if (pIVar24->Collapsed != false) {
        uVar43 = 0x500003;
      }
      BeginTabBarEx((ImGuiTabBar *)this,&local_48,uVar43,node);
      node->VisibleWindow = (ImGuiWindow *)0x0;
      if (0 < (node->Windows).Size) {
        uVar43 = (uint)local_98 >> 0xe;
        local_b8.x = (float)(uint)(IVar22 != 0 && fVar49 == fVar48);
        local_98 = &(pIVar24->DC).LastItemRect;
        lVar23 = 0;
        fVar29 = local_68.x;
        fVar47 = local_78.x;
        do {
          pIVar37 = (node->Windows).Data[lVar23];
          if (((((((byte)uVar43 & fVar49 == fVar48) == 0) && ((float)pIVar37->ID != local_b8.x)) ||
               (pIVar37->HasCloseButton != true)) || ((pIVar37->Flags & 0x100000) != 0)) &&
             (*(int *)((long)local_a8 + 0x1b18) <= pIVar37->LastFrameActive + 1 || fVar29 != fVar47)
             ) {
            local_f8[0] = 1;
            p_open = (bool *)0x0;
            if (pIVar37->HasCloseButton != false) {
              p_open = (bool *)local_f8;
            }
            TabItemEx((ImGuiTabBar *)this,pIVar37->Name,p_open,
                      (uint)*(ImGuiTabBarFlags *)((long)this + 0x10) >> 1 & 4 |
                      (uint)pIVar37->Flags >> 0x14 & 1,pIVar37);
            if ((bool)local_f8[0] == false) {
              node->WantCloseTabId = pIVar37->ID;
            }
            IVar22 = pIVar37->ID;
            if (*(ImGuiID *)((long)this + 0x20) == IVar22) {
              node->VisibleWindow = pIVar37;
            }
            pIVar37->DockTabItemStatusFlags = (pIVar24->DC).LastItemStatusFlags;
            IVar44 = local_98->Max;
            (pIVar37->DockTabItemRect).Min = local_98->Min;
            (pIVar37->DockTabItemRect).Max = IVar44;
            fVar29 = local_68.x;
            fVar47 = local_78.x;
            if (((*(ImGuiWindow **)((long)local_a8 + 0x1d70) != (ImGuiWindow *)0x0) &&
                ((*(ImGuiWindow **)((long)local_a8 + 0x1d70))->RootWindowDockStop == pIVar37)) &&
               (((pIVar37->DC).NavLayerActiveMask & 2) == 0)) {
              pIVar24->NavLastIds[1] = IVar22;
            }
          }
          lVar23 = lVar23 + 1;
        } while (lVar23 < (node->Windows).Size);
      }
      pIVar41 = local_90;
      IVar44 = local_a8;
      if ((node->VisibleWindow != (ImGuiWindow *)0x0) &&
         (((char)local_fc != '\0' || (pIVar33->VisibleWindow == (ImGuiWindow *)0x0)))) {
        pIVar33->VisibleWindow = node->VisibleWindow;
      }
      if ((-1 < (short)local_84) && (node->VisibleWindow != (ImGuiWindow *)0x0)) {
        if (node->VisibleWindow->HasCloseButton == false) {
          PushItemFlag(4,true);
          local_f8 = *(undefined1 (*) [8])((long)IVar44 + 0x16fc);
          uStack_f0 = (ImGuiDockNode *)
                      CONCAT44(*(float *)((long)IVar44 + 0x1708) * 0.5,
                               *(float *)((long)IVar44 + 0x1704));
          PushStyleColor(0,(ImVec4 *)local_f8);
        }
        local_b8.x = *(float *)((long)IVar44 + 0x1a30);
        IVar22 = ImGuiWindow::GetID(pIVar24,"#CLOSE",(char *)0x0);
        fVar48 = ((ImVec2 *)((long)IVar44 + 0x1678))->x;
        local_f8._4_4_ = local_c8.Min.y + 0.0;
        local_f8._0_4_ = ((-fVar48 - fVar48) - local_b8.x) + local_c8.Max.x;
        bVar18 = CloseButton(IVar22,(ImVec2 *)local_f8);
        if ((bVar18) &&
           (pIVar25 = TabBarFindTabByID((ImGuiTabBar *)this,*(ImGuiID *)((long)this + 0x20)),
           pIVar25 != (ImGuiTabItem *)0x0)) {
          node->WantCloseTabId = pIVar25->ID;
          TabBarCloseTab((ImGuiTabBar *)this,pIVar25);
        }
        if (node->VisibleWindow->HasCloseButton == false) {
          PopStyleColor(1);
          PopItemFlag();
        }
      }
      IVar22 = ImGuiWindow::GetID(pIVar24,"#TITLEBAR",(char *)0x0);
      if (((*(ImGuiID *)((long)IVar44 + 0x1bd4) == 0) ||
          (*(ImGuiID *)((long)IVar44 + 0x1bd4) == IVar22)) ||
         (*(ImGuiID *)((long)IVar44 + 0x1be8) == IVar22)) {
        ButtonBehavior(&local_c8,IVar22,(bool *)0x0,(bool *)local_f8,0x1000);
        if (*(ImGuiID *)((long)IVar44 + 0x1bd4) == IVar22) {
          (pIVar24->DC).LastItemId = IVar22;
          pIVar17 = GImGui;
          IVar22 = (GImGui->CurrentWindow->DC).LastItemId;
          if (GImGui->HoveredId == IVar22) {
            GImGui->HoveredIdAllowOverlap = true;
          }
          if (pIVar17->ActiveId == IVar22) {
            pIVar17->ActiveIdAllowOverlap = true;
          }
        }
        if ((bool)local_f8[0] == true) {
          fVar48 = (GImGui->IO).MouseDownDuration[0];
          if ((fVar48 == 0.0) && (!NAN(fVar48))) {
            local_d0 = (ulong)*(ImGuiID *)((long)this + 0x18);
          }
          pIVar25 = TabBarFindTabByID((ImGuiTabBar *)this,*(ImGuiID *)((long)this + 0x18));
          if (pIVar25 != (ImGuiTabItem *)0x0) {
            pIVar37 = pIVar25->Window;
            if (pIVar37 == (ImGuiWindow *)0x0) {
              pIVar37 = node->HostWindow;
            }
            StartMouseMovingWindowOrNode(pIVar37,node,false);
          }
        }
      }
      IVar22 = (ImGuiID)local_d0;
      if (*(ImGuiID *)((long)this + 0x1c) != 0) {
        IVar22 = *(ImGuiID *)((long)this + 0x1c);
      }
      if (((IVar22 != 0) &&
          (pIVar25 = TabBarFindTabByID((ImGuiTabBar *)this,IVar22), pIVar25 != (ImGuiTabItem *)0x0))
         && (pIVar25->Window != (ImGuiWindow *)0x0)) {
        FocusWindow(pIVar25->Window);
        NavInitWindow(pIVar25->Window,false);
      }
      EndTabBar();
      PopID();
      if ((node->LocalFlags & 0x400) == 0) {
        (pIVar24->DC).NavLayerCurrent = ImGuiNavLayer_Main;
        pIVar24->SkipItems = bVar39;
      }
    }
    else {
      pIVar37 = *(node->Windows).Data;
      node->VisibleWindow = pIVar37;
      *(ushort *)&node->field_0xb8 = uVar2 & 0xbbff | (ushort)(local_fc << 10);
      if (bVar38 != 0) {
        node->LastFrameFocused = ((ImGuiContext *)IVar44)->FrameCount;
      }
      if (pIVar37 != (ImGuiWindow *)0x0) {
        if ((bVar38 != 0) || (pIVar33->VisibleWindow == (ImGuiWindow *)0x0)) {
          pIVar33->VisibleWindow = pIVar37;
        }
        if (node->TabBar != (ImGuiTabBar *)0x0) {
          node->TabBar->VisibleTabId = node->VisibleWindow->ID;
        }
      }
    }
  }
  if ((node->TabBar == (ImGuiTabBar *)0x0) || (IVar22 = node->TabBar->SelectedTabId, IVar22 == 0)) {
    if ((node->Windows).Size < 1) goto LAB_0013d0d8;
    IVar22 = (*(node->Windows).Data)->ID;
  }
  node->SelectedTabId = IVar22;
LAB_0013d0d8:
  if (pIVar24 == (ImGuiWindow *)0x0) {
    node->LastFrameActive = pIVar41->FrameCount;
    cVar45 = (char)local_80;
  }
  else {
    if ((((node->field_0xb9 & 2) != 0) && (node->ParentNode == (ImGuiDockNode *)0x0)) &&
       ((pIVar41->MovingWindow == (ImGuiWindow *)0x0 ||
        (pIVar41->MovingWindow->RootWindow != pIVar24)))) {
      BeginDockableDragDropTarget(pIVar24);
    }
    node->LastFrameActive = pIVar41->FrameCount;
    if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
      DockNodeUpdate(node->ChildNodes[0]);
    }
    cVar45 = (char)local_80;
    if (node->ChildNodes[1] != (ImGuiDockNode *)0x0) {
      DockNodeUpdate(node->ChildNodes[1]);
    }
    if (node->ParentNode == (ImGuiDockNode *)0x0) {
      RenderWindowOuterBorders(pIVar24);
    }
  }
  if (cVar45 != '\0') {
    End();
  }
  return;
}

Assistant:

static void ImGui::DockNodeUpdate(ImGuiDockNode* node)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(node->LastFrameActive != g.FrameCount);
    node->LastFrameAlive = g.FrameCount;
    node->MarkedForPosSizeWrite = false;

    node->CentralNode = node->OnlyNodeWithWindows = NULL;
    if (node->IsRootNode())
        DockNodeUpdateForRootNode(node);

    // Remove tab bar if not needed
    if (node->TabBar && node->IsNoTabBar())
        DockNodeRemoveTabBar(node);

    // Early out for hidden root dock nodes (when all DockId references are in inactive windows, or there is only 1 floating window holding on the DockId)
    bool want_to_hide_host_window = false;
    if (node->Windows.Size <= 1 && node->IsFloatingNode() && node->IsLeafNode())
        if (!g.IO.ConfigDockingAlwaysTabBar && (node->Windows.Size == 0 || !node->Windows[0]->WindowClass.DockingAlwaysTabBar))
            want_to_hide_host_window = true;
    if (want_to_hide_host_window)
    {
        if (node->Windows.Size == 1)
        {
            // Floating window pos/size is authoritative
            ImGuiWindow* single_window = node->Windows[0];
            node->Pos = single_window->Pos;
            node->Size = single_window->SizeFull;
            node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_Window;

            // Transfer focus immediately so when we revert to a regular window it is immediately selected
            if (node->HostWindow && g.NavWindow == node->HostWindow)
                FocusWindow(single_window);
            if (node->HostWindow)
            {
                single_window->Viewport = node->HostWindow->Viewport;
                single_window->ViewportId = node->HostWindow->ViewportId;
                if (node->HostWindow->ViewportOwned)
                {
                    single_window->Viewport->Window = single_window;
                    single_window->ViewportOwned = true;
                }
            }
        }

        DockNodeHideHostWindow(node);
        node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
        node->WantCloseAll = false;
        node->WantCloseTabId = 0;
        node->HasCloseButton = node->HasWindowMenuButton = node->EnableCloseButton = false;
        node->LastFrameActive = g.FrameCount;

        if (node->WantMouseMove && node->Windows.Size == 1)
            DockNodeStartMouseMovingWindow(node, node->Windows[0]);
        return;
    }

    // In some circumstance we will defer creating the host window (so everything will be kept hidden),
    // while the expected visible window is resizing itself.
    // This is important for first-time (no ini settings restored) single window when io.ConfigDockingAlwaysTabBar is enabled,
    // otherwise the node ends up using the minimum window size. Effectively those windows will take an extra frame to show up:
    //   N+0: Begin(): window created (with no known size), node is created
    //   N+1: DockNodeUpdate(): node skip creating host window / Begin(): window size applied, not visible
    //   N+2: DockNodeUpdate(): node can create host window / Begin(): window becomes visible
    // We could remove this frame if we could reliably calculate the expected window size during node update, before the Begin() code.
    // It would require a generalization of CalcWindowExpectedSize(), probably extracting code away from Begin().
    // In reality it isn't very important as user quickly ends up with size data in .ini file.
    if (node->IsVisible && node->HostWindow == NULL && node->IsFloatingNode() && node->IsLeafNode())
    {
        IM_ASSERT(node->Windows.Size > 0);
        ImGuiWindow* ref_window = NULL;
        if (node->SelectedTabId != 0) // Note that we prune single-window-node settings on .ini loading, so this is generally 0 for them!
            ref_window = DockNodeFindWindowByID(node, node->SelectedTabId);
        if (ref_window == NULL)
            ref_window = node->Windows[0];
        if (ref_window->AutoFitFramesX > 0 || ref_window->AutoFitFramesY > 0)
        {
            node->State = ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing;
            return;
        }
    }

    const ImGuiDockNodeFlags node_flags = node->GetMergedFlags();

    // Bind or create host window
    ImGuiWindow* host_window = NULL;
    bool beginned_into_host_window = false;
    if (node->IsDockSpace())
    {
        // [Explicit root dockspace node]
        IM_ASSERT(node->HostWindow);
        node->EnableCloseButton = false;
        node->HasCloseButton = (node_flags & ImGuiDockNodeFlags_NoCloseButton) == 0;
        node->HasWindowMenuButton = (node_flags & ImGuiDockNodeFlags_NoWindowMenuButton) == 0;
        host_window = node->HostWindow;
    }
    else
    {
        // [Automatic root or child nodes]
        node->EnableCloseButton = false;
        node->HasCloseButton = (node->Windows.Size > 0) && (node_flags & ImGuiDockNodeFlags_NoCloseButton) == 0;
        node->HasWindowMenuButton = (node->Windows.Size > 0) && (node_flags & ImGuiDockNodeFlags_NoWindowMenuButton) == 0;
        for (int window_n = 0; window_n < node->Windows.Size; window_n++)
        {
            // FIXME-DOCK: Setting DockIsActive here means that for single active window in a leaf node, DockIsActive will be cleared until the next Begin() call.
            ImGuiWindow* window = node->Windows[window_n];
            window->DockIsActive = (node->Windows.Size > 1);
            node->EnableCloseButton |= window->HasCloseButton;
        }

        if (node->IsRootNode() && node->IsVisible)
        {
            ImGuiWindow* ref_window = (node->Windows.Size > 0) ? node->Windows[0] : NULL;

            // Sync Pos
            if (node->AuthorityForPos == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowPos(ref_window->Pos);
            else if (node->AuthorityForPos == ImGuiDataAuthority_DockNode)
                SetNextWindowPos(node->Pos);

            // Sync Size
            if (node->AuthorityForSize == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowSize(ref_window->SizeFull);
            else if (node->AuthorityForSize == ImGuiDataAuthority_DockNode)
                SetNextWindowSize(node->Size);

            // Sync Collapsed
            if (node->AuthorityForSize == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowCollapsed(ref_window->Collapsed);

            // Sync Viewport
            if (node->AuthorityForViewport == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowViewport(ref_window->ViewportId);

            SetNextWindowClass(&node->WindowClass);

            // Begin into the host window
            char window_label[20];
            DockNodeGetHostWindowTitle(node, window_label, IM_ARRAYSIZE(window_label));
            ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoScrollWithMouse | ImGuiWindowFlags_DockNodeHost;
            window_flags |= ImGuiWindowFlags_NoFocusOnAppearing;
            window_flags |= ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoNavFocus | ImGuiWindowFlags_NoCollapse;
            window_flags |= ImGuiWindowFlags_NoTitleBar;

            PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(0, 0));
            Begin(window_label, NULL, window_flags);
            PopStyleVar();
            beginned_into_host_window = true;

            node->HostWindow = host_window = g.CurrentWindow;
            host_window->DockNodeAsHost = node;
            host_window->DC.CursorPos = host_window->Pos;
            node->Pos = host_window->Pos;
            node->Size = host_window->Size;

            // We set ImGuiWindowFlags_NoFocusOnAppearing because we don't want the host window to take full focus (e.g. steal NavWindow)
            // But we still it bring it to the front of display. There's no way to choose this precise behavior via window flags.
            // One simple case to ponder if: window A has a toggle to create windows B/C/D. Dock B/C/D together, clear the toggle and enable it again.
            // When reappearing B/C/D will request focus and be moved to the top of the display pile, but they are not linked to the dock host window
            // during the frame they appear. The dock host window would keep its old display order, and the sorting in EndFrame would move B/C/D back
            // after the dock host window, losing their top-most status.
            if (node->HostWindow->Appearing)
                BringWindowToDisplayFront(node->HostWindow);

            node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_Auto;
        }
        else if (node->ParentNode)
        {
            node->HostWindow = host_window = node->ParentNode->HostWindow;
            node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_Auto;
        }
        if (node->WantMouseMove && node->HostWindow)
            DockNodeStartMouseMovingWindow(node, node->HostWindow);
    }

    // Update focused node (the one whose title bar is highlight) within a node tree
    if (node->IsSplitNode())
        IM_ASSERT(node->TabBar == NULL);
    if (node->IsRootNode())
        if (g.NavWindow && g.NavWindow->RootWindowDockStop->DockNode && g.NavWindow->RootWindowDockStop->ParentWindow == host_window)
            node->LastFocusedNodeId = g.NavWindow->RootWindowDockStop->DockNode->ID;

    // We need to draw a background at the root level if requested by ImGuiDockNodeFlags_PassthruCentralNode, but we will only know the correct pos/size after
    // processing the resizing splitters. So we are using the DrawList channel splitting facility to submit drawing primitives out of order!
    const bool render_dockspace_bg = node->IsRootNode() && host_window && (node_flags & ImGuiDockNodeFlags_PassthruCentralNode) != 0;
    if (render_dockspace_bg)
    {
        host_window->DrawList->ChannelsSplit(2);
        host_window->DrawList->ChannelsSetCurrent(1);
    }

    // Register a hit-test hole in the window unless we are currently dragging a window that is compatible with our dockspace
    const ImGuiDockNode* central_node = node->CentralNode;
    const bool central_node_hole = node->IsRootNode() && host_window && (node_flags & ImGuiDockNodeFlags_PassthruCentralNode) != 0 && central_node != NULL && central_node->IsEmpty();
    bool central_node_hole_register_hit_test_hole = central_node_hole;
    if (central_node_hole)
        if (const ImGuiPayload* payload = ImGui::GetDragDropPayload())
            if (payload->IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW) && DockNodeIsDropAllowed(host_window, *(ImGuiWindow**)payload->Data))
                central_node_hole_register_hit_test_hole = false;
    if (central_node_hole_register_hit_test_hole)
    {
        // Add a little padding to match the "resize from edges" behavior and allow grabbing the splitter easily.
        IM_ASSERT(node->IsDockSpace()); // We cannot pass this flag without the DockSpace() api. Testing this because we also setup the hole in host_window->ParentNode
        ImRect central_hole(central_node->Pos, central_node->Pos + central_node->Size);
        central_hole.Expand(ImVec2(-WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS, -WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS));
        if (central_node_hole && !central_hole.IsInverted())
        {
            SetWindowHitTestHole(host_window, central_hole.Min, central_hole.Max - central_hole.Min);
            SetWindowHitTestHole(host_window->ParentWindow, central_hole.Min, central_hole.Max - central_hole.Min);
        }
    }

    // Update position/size, process and draw resizing splitters
    if (node->IsRootNode() && host_window)
    {
        DockNodeTreeUpdatePosSize(node, host_window->Pos, host_window->Size);
        DockNodeTreeUpdateSplitter(node);
    }

    // Draw empty node background (currently can only be the Central Node)
    if (host_window && node->IsEmpty() && node->IsVisible && !(node_flags & ImGuiDockNodeFlags_PassthruCentralNode))
        host_window->DrawList->AddRectFilled(node->Pos, node->Pos + node->Size, GetColorU32(ImGuiCol_DockingEmptyBg));

    // Draw whole dockspace background if ImGuiDockNodeFlags_PassthruCentralNode if set.
    if (render_dockspace_bg && node->IsVisible)
    {
        host_window->DrawList->ChannelsSetCurrent(0);
        if (central_node_hole)
            RenderRectFilledWithHole(host_window->DrawList, node->Rect(), central_node->Rect(), GetColorU32(ImGuiCol_WindowBg), 0.0f);
        else
            host_window->DrawList->AddRectFilled(node->Pos, node->Pos + node->Size, GetColorU32(ImGuiCol_WindowBg), 0.0f);
        host_window->DrawList->ChannelsMerge();
    }

    // Draw and populate Tab Bar
    if (host_window && node->Windows.Size > 0)
    {
        DockNodeUpdateTabBar(node, host_window);
    }
    else
    {
        node->WantCloseAll = false;
        node->WantCloseTabId = 0;
        node->IsFocused = false;
    }
    if (node->TabBar && node->TabBar->SelectedTabId)
        node->SelectedTabId = node->TabBar->SelectedTabId;
    else if (node->Windows.Size > 0)
        node->SelectedTabId = node->Windows[0]->ID;

    // Draw payload drop target
    if (host_window && node->IsVisible)
        if (node->IsRootNode() && (g.MovingWindow == NULL || g.MovingWindow->RootWindow != host_window))
            BeginDockableDragDropTarget(host_window);

    // We update this after DockNodeUpdateTabBar()
    node->LastFrameActive = g.FrameCount;

    // Recurse into children
    // FIXME-DOCK FIXME-OPT: Should not need to recurse into children
    if (host_window)
    {
        if (node->ChildNodes[0])
            DockNodeUpdate(node->ChildNodes[0]);
        if (node->ChildNodes[1])
            DockNodeUpdate(node->ChildNodes[1]);

        // Render outer borders last (after the tab bar)
        if (node->IsRootNode())
            RenderWindowOuterBorders(host_window);
    }

    // End host window
    if (beginned_into_host_window) //-V1020
        End();
}